

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall QWidgetTextControlPrivate::updateCursorBlinking(QWidgetTextControlPrivate *this)

{
  uint uVar1;
  
  QBasicTimer::stop();
  if (this->cursorVisible == true) {
    QGuiApplication::styleHints();
    uVar1 = QStyleHints::cursorFlashTime();
    if (1 < (int)uVar1) {
      QBasicTimer::start(&this->cursorBlinkTimer,(ulong)(uVar1 >> 1) * 1000000,1,
                         *(undefined8 *)&this->field_0x8);
    }
  }
  this->cursorOn = this->cursorVisible;
  repaintCursor(this);
  return;
}

Assistant:

void QWidgetTextControlPrivate::updateCursorBlinking()
{
    cursorBlinkTimer.stop();
    if (cursorVisible) {
        int flashTime = QGuiApplication::styleHints()->cursorFlashTime();
        if (flashTime >= 2)
            cursorBlinkTimer.start(flashTime / 2, q_func());
    }

    cursorOn = cursorVisible;
    repaintCursor();
}